

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall Catch::ConsoleReporter::printClosedHeader(ConsoleReporter *this,string *_name)

{
  ostream *poVar1;
  
  printOpenHeader(this,_name);
  if (getLineOfChars<(char)46>()::line == '\0') {
    uRam0000000000171710 = 0x2e2e2e2e2e2e2e;
    uRam0000000000171717 = 0x2e2e2e2e2e2e2e2e;
    _DAT_00171700 = 0x2e2e2e2e2e2e2e2e;
    uRam0000000000171708 = 0x2e2e2e2e2e2e2e;
    DAT_0017170f = 0x2e;
    _DAT_001716f0 = 0x2e2e2e2e2e2e2e2e;
    uRam00000000001716f8 = 0x2e2e2e2e2e2e2e2e;
    _DAT_001716e0 = 0x2e2e2e2e2e2e2e2e;
    uRam00000000001716e8 = 0x2e2e2e2e2e2e2e2e;
    _line = 0x2e2e2e2e2e2e2e2e;
    uRam00000000001716d8 = 0x2e2e2e2e2e2e2e2e;
    DAT_0017171f = 0;
  }
  poVar1 = std::operator<<((this->super_StreamingReporterBase).stream,
                           &getLineOfChars<(char)46>()::line);
  std::operator<<(poVar1,"\n");
  return;
}

Assistant:

void printClosedHeader( std::string const& _name ) {
            printOpenHeader( _name );
            stream << getLineOfChars<'.'>() << "\n";
        }